

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Klex.cpp
# Opt level: O2

bool __thiscall Klex::nextToken(Klex *this)

{
  char quote;
  TokenType TVar1;
  bool isWord;
  string local_40;
  
  if ((this->currentChar == -1) ||
     (((this->isInterpolatedString == false && (this->isSimpleString == false)) &&
      (skipWhitespace(this), this->currentChar == -1)))) {
    setTokenToEOF(this);
    return false;
  }
  if (this->shouldParseOutString == true) {
    if (this->isSimpleString == true) {
      quote = '\'';
LAB_0010aa37:
      parseOutString_abi_cxx11_(&local_40,this,quote);
      std::__cxx11::string::operator=((string *)&this->lexeme,(string *)&local_40);
      std::__cxx11::string::~string((string *)&local_40);
      this->tokenType = String;
      this->shouldParseOutString = false;
      return true;
    }
    if (this->isInterpolatedString == true) {
      quote = '\"';
      goto LAB_0010aa37;
    }
  }
  switch(this->charClass) {
  case DIGIT:
    parseOutNumber_abi_cxx11_(&local_40,this);
    std::__cxx11::string::operator=((string *)&this->lexeme,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    this->tokenType = Number;
    break;
  case LETTER:
    parseOutWord_abi_cxx11_(&local_40,this);
    std::__cxx11::string::operator=((string *)&this->lexeme,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    isWord = true;
    goto LAB_0010abaa;
  case SINGLE_QUOTE:
    if (this->isSimpleString == false) {
      this->shouldParseOutString = true;
    }
    this->isSimpleString = (bool)(this->isSimpleString ^ 1);
    parseOutSymbol_abi_cxx11_(&local_40,this);
    std::__cxx11::string::operator=((string *)&this->lexeme,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    this->tokenType = SingleQuote;
    break;
  case DOUBLE_QUOTE:
    if (this->isInterpolatedString == false) {
      this->shouldParseOutString = true;
    }
    this->isInterpolatedString = (bool)(this->isInterpolatedString ^ 1);
    parseOutSymbol_abi_cxx11_(&local_40,this);
    std::__cxx11::string::operator=((string *)&this->lexeme,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    this->tokenType = DoubleQuote;
    break;
  case OTHER:
    parseOutSymbol_abi_cxx11_(&local_40,this);
    std::__cxx11::string::operator=((string *)&this->lexeme,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    isWord = false;
LAB_0010abaa:
    TVar1 = getTokenTypeOfLexeme(this,&this->lexeme,isWord);
    this->tokenType = TVar1;
  }
  return true;
}

Assistant:

bool Klex::nextToken() {
    if(getChar() == EOF) {
        setTokenToEOF();
        return false;
    }

    if(!isInterpolatedString && !isSimpleString)
        skipWhitespace();

    if(getChar() == EOF) {
        setTokenToEOF();
        return false;
    }

    if(shouldParseOutString && isSimpleString) {
        lexeme = parseOutString('\'');
        tokenType = TokenType::String;
        shouldParseOutString = false;
        return true;
    }

    if(shouldParseOutString && isInterpolatedString) {
        lexeme = parseOutString('"');
        tokenType = TokenType::String;
        shouldParseOutString = false;
        return true;
    }

    switch(getCharClass()) {
        case CharClass::LETTER:
            lexeme = parseOutWord();
            tokenType = getTokenTypeOfLexeme(lexeme, true);
            break;
        case CharClass::DIGIT:
            lexeme = parseOutNumber();
            tokenType = TokenType::Number;
            break;
        case CharClass::SINGLE_QUOTE:
            if(!isSimpleString)
                shouldParseOutString = true;
            isSimpleString = !isSimpleString;
            lexeme = parseOutSymbol();
            tokenType = TokenType::SingleQuote;
            break;
        case CharClass::DOUBLE_QUOTE:
            if(!isInterpolatedString)
                shouldParseOutString = true;
            isInterpolatedString = !isInterpolatedString;
            lexeme = parseOutSymbol();
            tokenType = TokenType::DoubleQuote;
            break;
        case CharClass::OTHER:
            lexeme = parseOutSymbol();
            tokenType = getTokenTypeOfLexeme(lexeme);
            break;
    }

    return true;
}